

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O2

PrefixRange __thiscall
Potassco::ProgramOptions::OptionContext::findImpl
          (OptionContext *this,char *key,FindType t,uint eMask,string *eCtx)

{
  __type _Var1;
  const_iterator cVar2;
  difference_type dVar3;
  UnknownOption *this_00;
  AmbiguousOption *this_01;
  PrefixRange PVar4;
  string k;
  string str;
  
  if (key == (char *)0x0) {
    key = "";
  }
  std::__cxx11::string::string((string *)&k,key,(allocator *)&str);
  if (((t == find_alias) && (k._M_string_length != 0)) && (*k._M_dataplus._M_p != '-')) {
    std::__cxx11::string::push_back((char)&k);
    *k._M_dataplus._M_p = '-';
  }
  PVar4.first._M_node =
       std::
       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::lower_bound((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      *)this,&k);
  cVar2 = PVar4.first._M_node;
  if ((_Rb_tree_header *)PVar4.first._M_node != &(this->index_)._M_t._M_impl.super__Rb_tree_header)
  {
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (PVar4.first._M_node + 1),&k);
    if (((t & (find_alias|find_name)) == 0) || (!_Var1)) {
      if ((t & find_prefix) != 0) {
        std::__cxx11::string::push_back((char)&k);
        cVar2 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                ::upper_bound((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                               *)this,&k);
        std::__cxx11::string::erase(&k,k._M_dataplus._M_p + (k._M_string_length - 1));
      }
    }
    else {
      cVar2._M_node = (_Base_ptr)std::_Rb_tree_increment(PVar4.first._M_node);
    }
  }
  dVar3 = std::
          __distance<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                    (PVar4.first._M_node,cVar2._M_node);
  if ((eMask != 0) && (dVar3 != 1)) {
    if ((PVar4.first._M_node == cVar2._M_node & (byte)eMask) == 1) {
      this_00 = (UnknownOption *)__cxa_allocate_exception(0x58);
      UnknownOption::UnknownOption(this_00,eCtx,&k);
      __cxa_throw(this_00,&UnknownOption::typeinfo,ContextError::~ContextError);
    }
    if ((PVar4.first._M_node != cVar2._M_node & (byte)eMask >> 1) == 1) {
      str._M_dataplus._M_p = (pointer)&str.field_2;
      str._M_string_length = 0;
      str.field_2._M_local_buf[0] = '\0';
      for (; PVar4.first._M_node != cVar2._M_node;
          PVar4.first._M_node = (_Base_ptr)std::_Rb_tree_increment(PVar4.first._M_node)) {
        std::__cxx11::string::append((char *)&str);
        std::__cxx11::string::append((string *)&str);
        std::__cxx11::string::append((char *)&str);
      }
      this_01 = (AmbiguousOption *)__cxa_allocate_exception(0x58);
      AmbiguousOption::AmbiguousOption(this_01,eCtx,&k,&str);
      __cxa_throw(this_01,&AmbiguousOption::typeinfo,ContextError::~ContextError);
    }
  }
  std::__cxx11::string::~string((string *)&k);
  PVar4.second._M_node = cVar2._M_node;
  return PVar4;
}

Assistant:

OptionContext::PrefixRange OptionContext::findImpl(const char* key, FindType t, unsigned eMask, const std::string& eCtx) const {
	std::string k(key ? key : "");
	if (t == find_alias && !k.empty() && k[0] != '-') {
		k += k[0];
		k[0] = '-';
	}
	index_iterator it = index_.lower_bound(k);
	index_iterator up = it;
	if (it != index_.end()) {
		if ((it->first == k) && ((t & (find_alias|find_name)) != 0)) {
			++up;
		}
		else if ((t & find_prefix) != 0) {
			k += char(CHAR_MAX);
			up = index_.upper_bound(k);
			k.erase(k.end()-1);
		}
	}
	if (std::distance(it, up) != 1 && eMask) {
		if ((eMask & 1u) && it == up) { throw UnknownOption(eCtx, k); }
		if ((eMask & 2u) && it != up) {
			std::string str;
			for (; it != up; ++it) {
				str += "  ";
				str += it->first;
				str += "\n";
			}
			throw AmbiguousOption(eCtx, k, str);
		}
	}
	return PrefixRange(it, up);
}